

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

void Abc_NtkLatchPipe(Abc_Ntk_t *pNtk,int nLatches)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pNode;
  Abc_Obj_t *pAVar3;
  char *pName;
  int nDigits;
  int nTotal;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int nLatches_local;
  Abc_Ntk_t *pNtk_local;
  
  if (0 < nLatches) {
    iVar1 = Abc_NtkPiNum(pNtk);
    iVar1 = Abc_Base10Log(nLatches * iVar1);
    vNodes_00 = Vec_PtrAlloc(100);
    for (nTotal = 0; iVar2 = Abc_NtkPiNum(pNtk), nTotal < iVar2; nTotal = nTotal + 1) {
      pNode = Abc_NtkPi(pNtk,nTotal);
      Abc_NodeCollectFanouts(pNode,vNodes_00);
      pFanout = pNode;
      for (nDigits = 0; nDigits < nLatches; nDigits = nDigits + 1) {
        pAVar3 = Abc_NtkCreateLatch(pNtk);
        Abc_ObjAddFanin(pAVar3,pFanout);
        Abc_LatchSetInitDc(pAVar3);
        pName = Abc_ObjNameDummy("LL",nTotal * nLatches + nDigits,iVar1);
        Abc_ObjAssignName(pAVar3,pName,(char *)0x0);
        pFanout = pAVar3;
      }
      for (nDigits = 0; iVar2 = Vec_PtrSize(vNodes_00), nDigits < iVar2; nDigits = nDigits + 1) {
        pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(vNodes_00,nDigits);
        Abc_ObjPatchFanin(pAVar3,pNode,pFanout);
      }
    }
    Vec_PtrFree(vNodes_00);
    Abc_NtkLogicMakeSimpleCos(pNtk,0);
  }
  return;
}

Assistant:

void Abc_NtkLatchPipe( Abc_Ntk_t * pNtk, int nLatches )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pLatch, * pFanin, * pFanout;
    int i, k, nTotal, nDigits;
    if ( nLatches < 1 )
        return;
    nTotal = nLatches * Abc_NtkPiNum(pNtk);
    nDigits = Abc_Base10Log( nTotal );
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        // remember current fanins of the PI
        Abc_NodeCollectFanouts( pObj, vNodes );
        // create the latches
        for ( pFanin = pObj, k = 0; k < nLatches; k++, pFanin = pLatch )
        {
            pLatch = Abc_NtkCreateLatch( pNtk );
            Abc_ObjAddFanin( pLatch, pFanin );
            Abc_LatchSetInitDc( pLatch );
            // create the name of the new latch
            Abc_ObjAssignName( pLatch, Abc_ObjNameDummy("LL", i*nLatches + k, nDigits), NULL );
        }
        // patch the PI fanouts
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pFanout, k )
            Abc_ObjPatchFanin( pFanout, pObj, pFanin );
    }
    Vec_PtrFree( vNodes );
    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
}